

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_swift.cpp
# Opt level: O2

void __thiscall
flatbuffers::swift::SwiftGenerator::GenerateVectorObjectAPITableExtension
          (SwiftGenerator *this,FieldDef *field_def)

{
  IdlNamer *this_00;
  CodeWriter *pCVar1;
  int *piVar2;
  BaseType BVar3;
  int iVar4;
  StructDef *pSVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar6;
  string code;
  string var;
  string field;
  string type;
  allocator<char> local_3a1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_380;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_360;
  allocator<char> local_339;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_338;
  string local_318;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f8;
  string local_2d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_298;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_278;
  string local_258;
  string local_238;
  string local_218;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  string local_198;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  string local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  string local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  string local_38;
  
  GenType_abi_cxx11_(&local_38,this,&(field_def->value).type,false);
  this_00 = &this->namer_;
  (*(this->namer_).super_Namer._vptr_Namer[7])(&local_338,this_00,field_def);
  (*(this_00->super_Namer)._vptr_Namer[0x12])(&local_2f8,this_00,field_def);
  BVar3 = (field_def->value).type.element;
  if (BVar3 == BASE_TYPE_UTYPE) goto LAB_0021fd77;
  if (BVar3 == BASE_TYPE_STRING) {
    std::operator+(&local_360,"let __",&local_338);
    std::operator+(&local_380,&local_360," = builder.createVector(ofStrings: obj.");
    std::operator+(&local_3a0,&local_380,&local_338);
    std::operator+(&local_298,&local_3a0,".compactMap({ $0 }) )");
    CodeWriter::operator+=(&this->code_,&local_298);
    pbVar6 = &local_298;
LAB_0021fd54:
    std::__cxx11::string::~string((string *)pbVar6);
    std::__cxx11::string::~string((string *)&local_3a0);
    std::__cxx11::string::~string((string *)&local_380);
    pbVar6 = &local_360;
  }
  else {
    if (BVar3 != BASE_TYPE_STRUCT) {
      if (BVar3 == BASE_TYPE_UNION) {
        std::operator+(&local_3a0,"var __",&local_338);
        std::operator+(&local_58,&local_3a0,"__: [Offset] = []");
        pCVar1 = &this->code_;
        CodeWriter::operator+=(pCVar1,&local_58);
        std::__cxx11::string::~string((string *)&local_58);
        std::__cxx11::string::~string((string *)&local_3a0);
        std::operator+(&local_3a0,"for i in obj.",&local_338);
        std::operator+(&local_78,&local_3a0," {");
        CodeWriter::operator+=(pCVar1,&local_78);
        std::__cxx11::string::~string((string *)&local_78);
        std::__cxx11::string::~string((string *)&local_3a0);
        piVar2 = &(this->code_).cur_ident_lvl_;
        *piVar2 = *piVar2 + 1;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_98,
                   "guard let off = i?.pack(builder: &builder) else { continue }",
                   (allocator<char> *)&local_3a0);
        CodeWriter::operator+=(pCVar1,&local_98);
        std::__cxx11::string::~string((string *)&local_98);
        std::operator+(&local_3a0,"__",&local_338);
        std::operator+(&local_b8,&local_3a0,"__.append(off)");
        CodeWriter::operator+=(pCVar1,&local_b8);
        std::__cxx11::string::~string((string *)&local_b8);
        std::__cxx11::string::~string((string *)&local_3a0);
        iVar4 = (this->code_).cur_ident_lvl_;
        if (iVar4 != 0) {
          (this->code_).cur_ident_lvl_ = iVar4 + -1;
        }
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_d8,"}",(allocator<char> *)&local_3a0);
        CodeWriter::operator+=(pCVar1,&local_d8);
        std::__cxx11::string::~string((string *)&local_d8);
        std::operator+(&local_360,"let __",&local_338);
        std::operator+(&local_380,&local_360," = builder.createVector(ofOffsets: __");
        std::operator+(&local_3a0,&local_380,&local_338);
        std::operator+(&local_f8,&local_3a0,"__)");
        CodeWriter::operator+=(pCVar1,&local_f8);
        std::__cxx11::string::~string((string *)&local_f8);
        std::__cxx11::string::~string((string *)&local_3a0);
        std::__cxx11::string::~string((string *)&local_380);
        std::__cxx11::string::~string((string *)&local_360);
        std::operator+(&local_360,"let __",&local_338);
        std::operator+(&local_380,&local_360,"Type = builder.createVector(obj.");
        std::operator+(&local_3a0,&local_380,&local_2f8);
        std::operator+(&local_118,&local_3a0,".compactMap { $0?.type })");
        CodeWriter::operator+=(pCVar1,&local_118);
        pbVar6 = &local_118;
      }
      else {
        std::operator+(&local_360,"let __",&local_338);
        std::operator+(&local_380,&local_360," = builder.createVector(obj.");
        std::operator+(&local_3a0,&local_380,&local_2f8);
        std::operator+(&local_2b8,&local_3a0,")");
        CodeWriter::operator+=(&this->code_,&local_2b8);
        pbVar6 = &local_2b8;
      }
      goto LAB_0021fd54;
    }
    pSVar5 = (field_def->value).type.struct_def;
    if ((pSVar5 != (StructDef *)0x0) && (pSVar5->fixed == false)) {
      std::operator+(&local_3a0,"var __",&local_338);
      std::operator+(&local_138,&local_3a0,"__: [Offset] = []");
      pCVar1 = &this->code_;
      CodeWriter::operator+=(pCVar1,&local_138);
      std::__cxx11::string::~string((string *)&local_138);
      std::__cxx11::string::~string((string *)&local_3a0);
      std::operator+(&local_3a0,"for var i in obj.",&local_338);
      std::operator+(&local_158,&local_3a0," {");
      CodeWriter::operator+=(pCVar1,&local_158);
      std::__cxx11::string::~string((string *)&local_158);
      std::__cxx11::string::~string((string *)&local_3a0);
      piVar2 = &(this->code_).cur_ident_lvl_;
      *piVar2 = *piVar2 + 1;
      std::operator+(&local_360,"__",&local_338);
      std::operator+(&local_380,&local_360,"__.append(");
      std::operator+(&local_3a0,&local_380,&local_38);
      std::operator+(&local_178,&local_3a0,".pack(&builder, obj: &i))");
      CodeWriter::operator+=(pCVar1,&local_178);
      std::__cxx11::string::~string((string *)&local_178);
      std::__cxx11::string::~string((string *)&local_3a0);
      std::__cxx11::string::~string((string *)&local_380);
      std::__cxx11::string::~string((string *)&local_360);
      iVar4 = (this->code_).cur_ident_lvl_;
      if (iVar4 != 0) {
        (this->code_).cur_ident_lvl_ = iVar4 + -1;
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_198,"}",(allocator<char> *)&local_3a0);
      CodeWriter::operator+=(pCVar1,&local_198);
      std::__cxx11::string::~string((string *)&local_198);
      std::operator+(&local_360,"let __",&local_338);
      std::operator+(&local_380,&local_360," = builder.createVector(ofOffsets: __");
      std::operator+(&local_3a0,&local_380,&local_338);
      std::operator+(&local_1b8,&local_3a0,"__)");
      CodeWriter::operator+=(pCVar1,&local_1b8);
      pbVar6 = &local_1b8;
      goto LAB_0021fd54;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2d8,"start_vector_of",&local_3a1);
    Namer::Method(&local_318,&this_00->super_Namer,&local_2d8,&local_338);
    std::operator+(&local_360,"{{STRUCTNAME}}.",&local_318);
    std::operator+(&local_380,&local_360,"(obj.");
    std::operator+(&local_3a0,&local_380,&local_2f8);
    std::operator+(&local_1d8,&local_3a0,".count, in: &builder)");
    pCVar1 = &this->code_;
    CodeWriter::operator+=(pCVar1,&local_1d8);
    std::__cxx11::string::~string((string *)&local_1d8);
    std::__cxx11::string::~string((string *)&local_3a0);
    std::__cxx11::string::~string((string *)&local_380);
    std::__cxx11::string::~string((string *)&local_360);
    std::__cxx11::string::~string((string *)&local_318);
    std::__cxx11::string::~string((string *)&local_2d8);
    local_3a0._M_dataplus._M_p = (pointer)&local_3a0.field_2;
    local_3a0._M_string_length = 0;
    local_3a0.field_2._M_local_buf[0] = '\0';
    pSVar5 = (field_def->value).type.struct_def;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_380,"",(allocator<char> *)&local_2d8);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_360,"",&local_3a1);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_318,"_o",&local_339);
    GenerateStructArgs(this,pSVar5,&local_3a0,&local_380,&local_360,&local_318,true);
    std::__cxx11::string::~string((string *)&local_318);
    std::__cxx11::string::~string((string *)&local_360);
    std::__cxx11::string::~string((string *)&local_380);
    std::__cxx11::string::substr((ulong)&local_380,(ulong)&local_3a0);
    std::__cxx11::string::operator=((string *)&local_3a0,(string *)&local_380);
    std::__cxx11::string::~string((string *)&local_380);
    std::operator+(&local_380,"for i in obj.",&local_2f8);
    std::operator+(&local_1f8,&local_380," {");
    CodeWriter::operator+=(pCVar1,&local_1f8);
    std::__cxx11::string::~string((string *)&local_1f8);
    std::__cxx11::string::~string((string *)&local_380);
    piVar2 = &(this->code_).cur_ident_lvl_;
    *piVar2 = *piVar2 + 1;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_218,"guard let _o = i else { continue }",
               (allocator<char> *)&local_380);
    CodeWriter::operator+=(pCVar1,&local_218);
    std::__cxx11::string::~string((string *)&local_218);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"builder.create(struct: _o)",(allocator<char> *)&local_380);
    CodeWriter::operator+=(pCVar1,&local_238);
    std::__cxx11::string::~string((string *)&local_238);
    iVar4 = (this->code_).cur_ident_lvl_;
    if (iVar4 != 0) {
      (this->code_).cur_ident_lvl_ = iVar4 + -1;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_258,"}",(allocator<char> *)&local_380);
    CodeWriter::operator+=(pCVar1,&local_258);
    std::__cxx11::string::~string((string *)&local_258);
    std::operator+(&local_318,"let __",&local_338);
    std::operator+(&local_360,&local_318," = builder.endVector(len: obj.");
    std::operator+(&local_380,&local_360,&local_2f8);
    std::operator+(&local_278,&local_380,".count)");
    CodeWriter::operator+=(pCVar1,&local_278);
    std::__cxx11::string::~string((string *)&local_278);
    std::__cxx11::string::~string((string *)&local_380);
    std::__cxx11::string::~string((string *)&local_360);
    std::__cxx11::string::~string((string *)&local_318);
    pbVar6 = &local_3a0;
  }
  std::__cxx11::string::~string((string *)pbVar6);
LAB_0021fd77:
  std::__cxx11::string::~string((string *)&local_2f8);
  std::__cxx11::string::~string((string *)&local_338);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void GenerateVectorObjectAPITableExtension(const FieldDef &field_def) {
    const Type &field_type = field_def.value.type;
    const auto type = GenType(field_type);
    const auto var = namer_.Variable(field_def);
    const auto field = namer_.Field(field_def);

    const auto vectortype = field_type.VectorType();
    switch (vectortype.base_type) {
      case BASE_TYPE_UNION: {
        code_ += "var __" + var + "__: [Offset] = []";
        code_ += "for i in obj." + var + " {";
        Indent();
        code_ += "guard let off = i?.pack(builder: &builder) else { continue }";
        code_ += "__" + var + "__.append(off)";
        Outdent();
        code_ += "}";
        code_ += "let __" + var + " = builder.createVector(ofOffsets: __" +
                 var + "__)";
        code_ += "let __" + var + "Type = builder.createVector(obj." + field +
                 ".compactMap { $0?.type })";
        break;
      }
      case BASE_TYPE_UTYPE: break;
      case BASE_TYPE_STRUCT: {
        if (field_type.struct_def && !field_type.struct_def->fixed) {
          code_ += "var __" + var + "__: [Offset] = []";
          code_ += "for var i in obj." + var + " {";
          Indent();
          code_ +=
              "__" + var + "__.append(" + type + ".pack(&builder, obj: &i))";
          Outdent();
          code_ += "}";
          code_ += "let __" + var + " = builder.createVector(ofOffsets: __" +
                   var + "__)";
        } else {
          code_ += "{{STRUCTNAME}}." + namer_.Method("start_vector_of", var) +
                   "(obj." + field + ".count, in: &builder)";
          std::string code;
          GenerateStructArgs(*field_type.struct_def, &code, "", "", "_o", true);
          code = code.substr(0, code.size() - 2);
          code_ += "for i in obj." + field + " {";
          Indent();
          code_ += "guard let _o = i else { continue }";
          code_ += "builder.create(struct: _o)";
          Outdent();
          code_ += "}";
          code_ += "let __" + var + " = builder.endVector(len: obj." + field +
                   ".count)";
        }
        break;
      }
      case BASE_TYPE_STRING: {
        code_ += "let __" + var + " = builder.createVector(ofStrings: obj." +
                 var + ".compactMap({ $0 }) )";
        break;
      }
      default: {
        code_ += "let __" + var + " = builder.createVector(obj." + field + ")";
        break;
      }
    }
  }